

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O3

vector<CardStyle,_std::allocator<CardStyle>_> * __thiscall
BattleWithLandlord::GenStrategy
          (vector<CardStyle,_std::allocator<CardStyle>_> *__return_storage_ptr__,
          BattleWithLandlord *this,multiset<char,_std::less<char>,_std::allocator<char>_> *style,
          CardStyle *last)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 uVar3;
  undefined1 uVar4;
  _Rb_tree_color _Var5;
  pointer pmVar6;
  bool bVar7;
  Type TVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  CardStyle *pCVar14;
  _Base_ptr p_Var15;
  _Base_ptr p_Var16;
  _Base_ptr p_Var17;
  ulong uVar18;
  uint uVar19;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs;
  _Rb_tree_header *p_Var20;
  vector<CardStyle,std::allocator<CardStyle>> *pvVar21;
  int iVar22;
  multiset<char,_std::less<char>,_std::allocator<char>_> *cs_1;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  multiset<char,_std::less<char>,_std::allocator<char>_> *__range7;
  pointer pmVar25;
  int iVar26;
  char x;
  int carry;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms_1;
  char x_2;
  multiset<char,_std::less<char>,_std::allocator<char>_> ms;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  comb_res;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count;
  multiset<char,_std::less<char>,_std::allocator<char>_> _union;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> count_;
  Type local_1cc;
  vector<CardStyle,std::allocator<CardStyle>> *local_1c8;
  CardStyle *local_1c0;
  Type local_1b4;
  _Rb_tree_node_base *local_1b0;
  int *local_1a8;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_1a0;
  Type local_16c;
  undefined1 local_168 [12];
  int local_15c;
  _Base_ptr local_158;
  _Base_ptr local_150;
  _Base_ptr local_148;
  _Base_ptr local_140;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  local_128;
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_108;
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  local_d8 [2];
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  local_a0;
  ulong local_70;
  long local_68;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CardStyle,_std::allocator<CardStyle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var2 = &local_108._M_impl.super__Rb_tree_header;
  local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_108._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_108._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var10 = (style->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var20 = &(style->_M_t)._M_impl.super__Rb_tree_header;
  local_1c8 = (vector<CardStyle,std::allocator<CardStyle>> *)__return_storage_ptr__;
  local_1c0 = last;
  if ((_Rb_tree_header *)p_Var10 != p_Var20) {
    do {
      p_Var1 = p_Var10 + 1;
      if (local_108._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00108147:
        pmVar9 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)&local_108,(key_type *)p_Var1);
        *pmVar9 = 1;
      }
      else {
        uVar3 = (undefined1)p_Var1->_M_color;
        p_Var17 = local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var23 = &p_Var2->_M_header;
        do {
          p_Var24 = p_Var23;
          p_Var16 = p_Var17;
          uVar4 = (undefined1)p_Var16[1]._M_color;
          p_Var23 = p_Var16;
          if ((char)uVar4 < (char)uVar3) {
            p_Var23 = p_Var24;
          }
          p_Var17 = (&p_Var16->_M_left)[(char)uVar4 < (char)uVar3];
        } while ((&p_Var16->_M_left)[(char)uVar4 < (char)uVar3] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var23 == p_Var2) goto LAB_00108147;
        if ((char)uVar4 < (char)uVar3) {
          p_Var16 = p_Var24;
        }
        if ((char)uVar3 < (char)p_Var16[1]._M_color) goto LAB_00108147;
        pmVar9 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)&local_108,(key_type *)p_Var1);
        *pmVar9 = *pmVar9 + 1;
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var20);
    p_Var10 = local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var17 = &p_Var2->_M_header;
    if (local_108._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      do {
        p_Var16 = p_Var17;
        p_Var23 = p_Var10;
        uVar3 = (undefined1)p_Var23[1]._M_color;
        p_Var17 = p_Var23;
        if ((char)uVar3 < '\x11') {
          p_Var17 = p_Var16;
        }
        p_Var10 = (&p_Var23->_M_left)[(char)uVar3 < '\x11'];
      } while ((&p_Var23->_M_left)[(char)uVar3 < '\x11'] != (_Base_ptr)0x0);
      p_Var10 = local_108._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var24 = &p_Var2->_M_header;
      p_Var15 = &p_Var2->_M_header;
      if ((_Rb_tree_header *)p_Var17 != p_Var2) {
        if ((char)uVar3 < '\x11') {
          p_Var23 = p_Var16;
        }
        p_Var15 = p_Var17;
        if ('\x11' < (char)p_Var23[1]._M_color) {
          p_Var15 = &p_Var2->_M_header;
        }
      }
      do {
        p_Var23 = p_Var24;
        p_Var17 = p_Var10;
        uVar3 = (undefined1)p_Var17[1]._M_color;
        p_Var24 = p_Var17;
        if ((char)uVar3 < '\x12') {
          p_Var24 = p_Var23;
        }
        p_Var10 = (&p_Var17->_M_left)[(char)uVar3 < '\x12'];
      } while ((&p_Var17->_M_left)[(char)uVar3 < '\x12'] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var24 != p_Var2) {
        if ((char)uVar3 < '\x12') {
          p_Var17 = p_Var23;
        }
        if (((_Rb_tree_header *)p_Var15 != p_Var2) && ((char)p_Var17[1]._M_color < '\x13')) {
          local_150 = (_Base_ptr)(local_168 + 8);
          local_168._8_4_ = _S_red;
          local_158 = (_Base_ptr)0x0;
          local_140 = (_Base_ptr)0x0;
          local_1a0._M_impl._0_1_ =
               (_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>)0x11;
          local_148 = local_150;
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          _M_insert_equal<char>
                    ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                      *)local_168,(char *)&local_1a0);
          local_1a0._M_impl._0_1_ = 0x12;
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          _M_insert_equal<char>
                    ((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                      *)local_168,(char *)&local_1a0);
          local_1a0._M_impl._0_4_ = 6;
          local_a0._M_impl._0_4_ = 0x13;
          std::vector<CardStyle,std::allocator<CardStyle>>::
          emplace_back<CardStyle::Type,int,std::multiset<char,std::less<char>,std::allocator<char>>&>
                    (local_1c8,(Type *)&local_1a0,(int *)&local_a0,
                     (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168);
          std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
          ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                     *)local_168);
        }
      }
    }
  }
  if (local_1c0->type == PASS) {
    if ((_Rb_tree_header *)local_108._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var10 = local_108._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        local_1b0 = p_Var10;
        if (0 < *(int *)&p_Var10[1].field_0x4) {
          p_Var1 = p_Var10 + 1;
          uVar18 = 1;
          do {
            local_168._8_4_ = _S_red;
            local_158 = (_Base_ptr)0x0;
            local_150 = (_Base_ptr)(local_168 + 8);
            local_140 = (_Base_ptr)0x0;
            local_148 = local_150;
            local_70 = uVar18;
            do {
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)local_168,(char *)p_Var1);
              uVar19 = (int)uVar18 - 1;
              uVar18 = (ulong)uVar19;
            } while (uVar19 != 0);
            iVar26 = (int)local_70;
            if (iVar26 == 1) {
              if ((char)p_Var1->_M_color < '\x01') {
                local_1a0._M_impl._0_4_ = 7;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          (local_1c8,(Type *)&local_1a0,(char *)p_Var1,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168);
              }
              else {
                local_1a0._M_impl._0_4_ = 1;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          (local_1c8,(Type *)&local_1a0,(char *)p_Var1,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168);
              }
              local_1a0._M_impl._0_4_ = 1;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1b0);
              if ((_Rb_tree_header *)p_Var11 != &local_108._M_impl.super__Rb_tree_header) {
                iVar26 = (int)(char)p_Var1->_M_color;
                do {
                  iVar22 = (int)(char)p_Var11[1]._M_color;
                  if (iVar26 + 1 != iVar22) break;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_168,(char *)(p_Var11 + 1));
                  iVar26 = local_1a0._M_impl._0_4_ + 1;
                  bVar7 = 3 < (int)local_1a0._M_impl._0_4_;
                  local_1a0._M_impl._0_4_ = iVar26;
                  if (bVar7) {
                    local_a0._M_impl._0_4_ = 1;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                              (local_1c8,(Type *)&local_a0,(char *)p_Var1,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168,
                               (int *)&local_1a0);
                  }
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                  iVar26 = iVar22;
                } while ((_Rb_tree_header *)p_Var11 != &local_108._M_impl.super__Rb_tree_header);
              }
            }
            else if (iVar26 == 2) {
              local_1a0._M_impl._0_4_ = 2;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)&local_1a0,(char *)p_Var1,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168);
              local_1a0._M_impl._0_4_ = 1;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1b0);
              if ((_Rb_tree_header *)p_Var11 != &local_108._M_impl.super__Rb_tree_header) {
                iVar26 = (int)(char)p_Var1->_M_color;
                do {
                  iVar22 = (int)(char)p_Var11[1]._M_color;
                  if ((iVar26 + 1 != iVar22) || (*(int *)&p_Var11[1].field_0x4 < 2)) break;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_168,(char *)(p_Var11 + 1));
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_168,(char *)(p_Var11 + 1));
                  iVar26 = local_1a0._M_impl._0_4_ + 1;
                  bVar7 = 1 < (int)local_1a0._M_impl._0_4_;
                  local_1a0._M_impl._0_4_ = iVar26;
                  if (bVar7) {
                    local_a0._M_impl._0_4_ = 2;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                              (local_1c8,(Type *)&local_a0,(char *)p_Var1,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168,
                               (int *)&local_1a0);
                  }
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                  iVar26 = iVar22;
                } while ((_Rb_tree_header *)p_Var11 != &local_108._M_impl.super__Rb_tree_header);
              }
            }
            else if (iVar26 == 3) {
              local_1a0._M_impl._0_4_ = 3;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)&local_1a0,(char *)p_Var1,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168);
              local_1cc = MONO;
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_1b0);
              if ((_Rb_tree_header *)p_Var11 != &local_108._M_impl.super__Rb_tree_header) {
                iVar26 = (int)(char)p_Var1->_M_color;
                do {
                  iVar22 = (int)(char)p_Var11[1]._M_color;
                  if ((iVar26 + 1 != iVar22) || (*(int *)&p_Var11[1].field_0x4 < 3)) break;
                  p_Var12 = p_Var11 + 1;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_168,(char *)p_Var12);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_168,(char *)p_Var12);
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)local_168,(char *)p_Var12);
                  local_1cc = local_1cc + MONO;
                  local_1a0._M_impl._0_4_ = 3;
                  std::vector<CardStyle,std::allocator<CardStyle>>::
                  emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                            (local_1c8,(Type *)&local_1a0,(char *)p_Var1,
                             (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168,
                             (int *)&local_1cc);
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                  iVar26 = iVar22;
                } while ((_Rb_tree_header *)p_Var11 != &local_108._M_impl.super__Rb_tree_header);
              }
              local_128.
              super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
              lVar13 = 0;
              do {
                local_68 = lVar13;
                local_1b4 = *(Type *)((long)&local_128.
                                             super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar13);
                std::
                _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
                clear((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                       *)local_168);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)local_168,(char *)p_Var1);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)local_168,(char *)p_Var1);
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)local_168,(char *)p_Var1);
                local_1cc = MONO;
                iVar26 = (int)(char)p_Var1->_M_color;
                std::
                _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                            *)&local_1a0,&local_108);
                p_Var11 = local_1b0;
                if ((_Rb_tree_header *)local_1b0 != &local_108._M_impl.super__Rb_tree_header) {
                  while( true ) {
                    pmVar9 = std::
                             map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                             ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                           *)&local_1a0,(key_type *)(p_Var11 + 1));
                    *pmVar9 = 0;
                    local_d8[0].
                    super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_d8[0].
                    super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_d8[0].
                    super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    bVar7 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                      *)&local_1a0,local_1cc,local_1b4,local_d8);
                    local_1a8 = (int *)CONCAT44(local_1a8._4_4_,iVar26);
                    if ((bVar7) &&
                       (local_1c0 = (CardStyle *)
                                    local_d8[0].
                                    super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                       pCVar14 = (CardStyle *)
                                 local_d8[0].
                                 super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                       local_d8[0].
                       super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start !=
                       local_d8[0].
                       super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)) {
                      do {
                        std::
                        _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                        ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                    *)&local_a0,
                                   (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                    *)local_168);
                        for (p_Var12 = *(_Rb_tree_node_base **)
                                        &(pCVar14->pattern)._M_t._M_impl.super__Rb_tree_header.
                                         _M_header; p_Var12 != (_Rb_tree_node_base *)&pCVar14->len;
                            p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
                          uVar19 = local_16c >> 8;
                          local_16c = CONCAT31((int3)uVar19,(char)p_Var12[1]._M_color);
                          std::
                          _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          ::_M_insert_equal<char_const&>
                                    ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                      *)&local_a0,(char *)&local_16c);
                        }
                        local_16c = TRIPLE;
                        std::vector<CardStyle,std::allocator<CardStyle>>::
                        emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int&>
                                  (local_1c8,&local_16c,(char *)p_Var1,
                                   (multiset<char,_std::less<char>,_std::allocator<char>_> *)
                                   &local_a0,(int *)&local_1cc,(int *)&local_1b4);
                        std::
                        _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                        ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                     *)&local_a0);
                        pCVar14 = (CardStyle *)
                                  &(pCVar14->pattern)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_right;
                      } while (pCVar14 != local_1c0);
                    }
                    p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                    if ((_Rb_tree_header *)p_Var11 == &local_108._M_impl.super__Rb_tree_header)
                    break;
                    iVar26 = (int)(char)p_Var11[1]._M_color;
                    if (((int)local_1a8 + 1 != iVar26) || (*(int *)&p_Var11[1].field_0x4 < 3))
                    break;
                    p_Var12 = p_Var11 + 1;
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)local_168,(char *)p_Var12);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)local_168,(char *)p_Var12);
                    std::
                    _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                    _M_insert_equal<char_const&>
                              ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                *)local_168,(char *)p_Var12);
                    local_1cc = local_1cc + MONO;
                    std::
                    vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                    ::~vector(local_d8);
                  }
                  std::
                  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                  ::~vector(local_d8);
                }
                std::
                _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                             *)&local_1a0);
                lVar13 = local_68 + 4;
              } while (lVar13 != 8);
            }
            else {
              local_1a0._M_impl._0_4_ = 5;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)&local_1a0,(char *)p_Var1,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_168);
              std::
              _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
              ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                          *)&local_1a0,&local_108);
              pmVar9 = std::
                       map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                       ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                     *)&local_1a0,(key_type *)p_Var1);
              *pmVar9 = *pmVar9 + -4;
              local_128.
              super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000001;
              pCVar14 = (CardStyle *)0x0;
              do {
                local_1cc = *(Type *)((long)&pCVar14->type +
                                     (long)&local_128.
                                            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                     );
                local_d8[0].
                super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_d8[0].
                super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_d8[0].
                super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                local_1c0 = pCVar14;
                bVar7 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                  *)&local_1a0,2,local_1cc,local_d8);
                pmVar6 = local_d8[0].
                         super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                pCVar14 = (CardStyle *)
                          local_d8[0].
                          super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (bVar7) {
                  for (; pCVar14 != (CardStyle *)pmVar6;
                      pCVar14 = (CardStyle *)
                                &(pCVar14->pattern)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_right) {
                    std::
                    _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                *)&local_a0,
                               (_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                *)local_168);
                    for (p_Var11 = *(_Rb_tree_node_base **)
                                    &(pCVar14->pattern)._M_t._M_impl.super__Rb_tree_header._M_header
                        ; p_Var11 != (_Rb_tree_node_base *)&pCVar14->len;
                        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
                      uVar19 = local_1b4 >> 8;
                      local_1b4 = CONCAT31((int3)uVar19,(char)p_Var11[1]._M_color);
                      std::
                      _Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                      ::_M_insert_equal<char_const&>
                                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                                  *)&local_a0,(char *)&local_1b4);
                    }
                    local_1b4 = QUARD;
                    local_16c = PAIR;
                    std::vector<CardStyle,std::allocator<CardStyle>>::
                    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int&>
                              (local_1c8,&local_1b4,(char *)p_Var1,
                               (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_a0,
                               (int *)&local_16c,(int *)&local_1cc);
                    std::
                    _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                    ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                                 *)&local_a0);
                  }
                }
                std::
                vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                ::~vector(local_d8);
                pCVar14 = (CardStyle *)&local_1c0->id;
              } while (pCVar14 != (CardStyle *)0x8);
              std::
              _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
              ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                           *)&local_1a0);
            }
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                         *)local_168);
            uVar19 = (uint)local_70;
          } while ((uVar19 < 4) &&
                  (uVar18 = (ulong)(uVar19 + 1), (int)uVar19 < *(int *)&local_1b0[1].field_0x4));
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(local_1b0);
      } while ((_Rb_tree_header *)p_Var10 != &local_108._M_impl.super__Rb_tree_header);
    }
    pvVar21 = local_1c8;
    std::
    sort<__gnu_cxx::__normal_iterator<CardStyle*,std::vector<CardStyle,std::allocator<CardStyle>>>,BattleWithLandlord::GenStrategy(std::multiset<char,std::less<char>,std::allocator<char>>const&,CardStyle_const&)const::__0>
              (*(undefined8 *)local_1c8,*(undefined8 *)(local_1c8 + 8));
  }
  else {
    if ((_Rb_tree_header *)local_108._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      local_1a8 = &local_1c0->carry;
      p_Var10 = local_108._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_001082c6:
      local_1a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1a0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1a0._M_impl.super__Rb_tree_header._M_header;
      local_1a0._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var1 = p_Var10 + 1;
      local_1b0 = p_Var10;
      local_1a0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1a0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (*(int *)&p_Var10[1].field_0x4 != 4) {
LAB_0010853e:
        TVar8 = local_1c0->type;
        if (TVar8 != TRIPLE) {
          if (TVar8 == PAIR) {
            if ((local_1c0->id < (int)(char)p_Var1->_M_color) &&
               (1 < *(int *)&local_1b0[1].field_0x4)) {
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_1a0,(char *)p_Var1);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_1a0,(char *)p_Var1);
              if (local_1c0->len == 1) {
                local_168._0_4_ = PAIR;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                          (local_1c8,(Type *)local_168,(char *)p_Var1,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_1a0);
              }
              else {
                local_168._0_4_ = MONO;
                p_Var11 = local_1b0;
                iVar26 = (int)(char)p_Var1->_M_color;
                do {
                  p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                  if ((((_Rb_tree_header *)p_Var11 == &local_108._M_impl.super__Rb_tree_header) ||
                      (iVar22 = (int)(char)p_Var11[1]._M_color, iVar26 + 1 != iVar22)) ||
                     (*(int *)&p_Var11[1].field_0x4 < 2)) goto LAB_00108abb;
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&local_1a0,(char *)(p_Var11 + 1));
                  std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                  ::_M_insert_equal<char_const&>
                            ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                              *)&local_1a0,(char *)(p_Var11 + 1));
                  TVar8 = local_168._0_4_ + MONO;
                  bVar7 = (int)local_168._0_4_ < 2;
                  iVar26 = iVar22;
                  local_168._0_4_ = TVar8;
                } while ((bVar7) || (TVar8 != local_1c0->len));
                local_a0._M_impl._0_4_ = 2;
                std::vector<CardStyle,std::allocator<CardStyle>>::
                emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                          (local_1c8,(Type *)&local_a0,(char *)p_Var1,
                           (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_1a0,
                           (int *)local_168);
              }
            }
          }
          else if ((TVar8 == MONO) && (local_1c0->id < (int)(char)p_Var1->_M_color)) {
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&local_1a0,(char *)p_Var1);
            if (local_1c0->len == 1) {
              local_168._0_4_ = MONO;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                        (local_1c8,(Type *)local_168,(char *)p_Var1,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_1a0);
            }
            else {
              local_168._0_4_ = MONO;
              p_Var11 = local_1b0;
              iVar26 = (int)(char)p_Var1->_M_color;
              do {
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
                if (((_Rb_tree_header *)p_Var11 == &local_108._M_impl.super__Rb_tree_header) ||
                   (iVar22 = (int)(char)p_Var11[1]._M_color, iVar26 + 1 != iVar22))
                goto LAB_00108abb;
                std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
                _M_insert_equal<char_const&>
                          ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                            *)&local_1a0,(char *)(p_Var11 + 1));
                TVar8 = local_168._0_4_ + MONO;
                bVar7 = (int)local_168._0_4_ < 4;
                iVar26 = iVar22;
                local_168._0_4_ = TVar8;
              } while ((bVar7) || (TVar8 != local_1c0->len));
              local_a0._M_impl._0_4_ = 1;
              std::vector<CardStyle,std::allocator<CardStyle>>::
              emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                        (local_1c8,(Type *)&local_a0,(char *)p_Var1,
                         (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_1a0,
                         (int *)local_168);
            }
          }
          goto LAB_00108abb;
        }
        if (((int)(char)p_Var1->_M_color <= local_1c0->id) || (*(int *)&local_1b0[1].field_0x4 < 3))
        goto LAB_00108abb;
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &local_1a0,(char *)p_Var1);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &local_1a0,(char *)p_Var1);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &local_1a0,(char *)p_Var1);
        if (*local_1a8 == 0) {
          if (local_1c0->len == 1) {
            local_168._0_4_ = TRIPLE;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&>
                      (local_1c8,(Type *)local_168,(char *)p_Var1,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_1a0);
          }
          else {
            local_168._0_4_ = MONO;
            p_Var11 = local_1b0;
            iVar26 = (int)(char)p_Var1->_M_color;
            do {
              p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
              if ((((_Rb_tree_header *)p_Var11 == &local_108._M_impl.super__Rb_tree_header) ||
                  (iVar22 = (int)(char)p_Var11[1]._M_color, iVar26 + 1 != iVar22)) ||
                 (*(int *)&p_Var11[1].field_0x4 < 3)) goto LAB_00108abb;
              p_Var12 = p_Var11 + 1;
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_1a0,(char *)p_Var12);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_1a0,(char *)p_Var12);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)&local_1a0,(char *)p_Var12);
              local_168._0_4_ = local_168._0_4_ + MONO;
              iVar26 = iVar22;
            } while (local_168._0_4_ != local_1c0->len);
            local_a0._M_impl._0_4_ = 3;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&>
                      (local_1c8,(Type *)&local_a0,(char *)p_Var1,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_1a0,
                       (int *)local_168);
          }
          goto LAB_00108abb;
        }
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        clear(&local_1a0);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &local_1a0,(char *)p_Var1);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &local_1a0,(char *)p_Var1);
        std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
        _M_insert_equal<char_const&>
                  ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                   &local_1a0,(char *)p_Var1);
        local_128.
        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_128.
                               super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
        _Var5 = p_Var1->_M_color;
        std::
        _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
        ::_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                    *)local_168,&local_108);
        p_Var11 = local_1b0;
        iVar26 = (int)(char)_Var5;
        if ((_Rb_tree_header *)local_1b0 != &local_108._M_impl.super__Rb_tree_header) {
          while( true ) {
            pmVar9 = std::
                     map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
                     operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                 *)local_168,(key_type *)(p_Var11 + 1));
            *pmVar9 = 0;
            local_d8[0].
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d8[0].
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8[0].
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (((uint)local_128.
                       super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == local_1c0->len) &&
               (bVar7 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                                  *)local_168,
                                 (uint)local_128.
                                       super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start,*local_1a8,local_d8
                                ),
               pmVar6 = local_d8[0].
                        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
               pCVar14 = (CardStyle *)
                         local_d8[0].
                         super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, bVar7)) goto LAB_00108a0b;
            p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
            if (((_Rb_tree_header *)p_Var11 == &local_108._M_impl.super__Rb_tree_header) ||
               ((iVar22 = (int)(char)p_Var11[1]._M_color, iVar26 + 1 != iVar22 ||
                (*(int *)&p_Var11[1].field_0x4 < 3)))) break;
            p_Var12 = p_Var11 + 1;
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&local_1a0,(char *)p_Var12);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&local_1a0,(char *)p_Var12);
            std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
            _M_insert_equal<char_const&>
                      ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                        *)&local_1a0,(char *)p_Var12);
            local_128.
            super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_128.
                                   super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   (uint)local_128.
                                         super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1);
            std::
            vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
            ::~vector(local_d8);
            iVar26 = iVar22;
          }
          goto LAB_00108a9c;
        }
        goto LAB_00108aa4;
      }
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 &local_1a0,(char *)p_Var1);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 &local_1a0,(char *)p_Var1);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 &local_1a0,(char *)p_Var1);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 &local_1a0,(char *)p_Var1);
      _Var5 = p_Var1->_M_color;
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      _Rb_tree(&local_60,&local_1a0);
      CardStyle::CardStyle
                ((CardStyle *)local_168,QUARD_BOMB,(int)(char)_Var5,
                 (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_60,1,0);
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree(&local_60);
      TVar8 = local_1c0->type;
      if (local_168._0_4_ == PASS || TVar8 != PASS) {
        if (((TVar8 == local_168._0_4_) && (local_1c0->len == local_168._8_4_)) &&
           (*local_1a8 == local_15c)) {
          if (local_1c0->id < (int)local_168._4_4_) goto LAB_001083c6;
        }
        else if ((local_168._0_4_ == JOKER_BOMB) ||
                (local_168._0_4_ == QUARD_BOMB && TVar8 != JOKER_BOMB)) goto LAB_001083c6;
      }
      else {
LAB_001083c6:
        std::vector<CardStyle,std::allocator<CardStyle>>::emplace_back<CardStyle&>
                  (local_1c8,(CardStyle *)local_168);
        TVar8 = local_1c0->type;
      }
      if (TVar8 != QUARD) {
LAB_00108529:
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        clear(&local_1a0);
        std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
        ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                   *)&local_158);
        goto LAB_0010853e;
      }
      if (local_1c0->id < (int)(char)p_Var1->_M_color) {
        std::
        _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
        ::_Rb_tree(&local_a0,&local_108);
        pmVar9 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                               *)&local_a0,(key_type *)p_Var1);
        *pmVar9 = *pmVar9 + -4;
        local_128.
        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.
        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_128.
        super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar7 = GenCarry((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                          *)&local_a0,2,*local_1a8,&local_128);
        pmVar6 = local_128.
                 super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pmVar25 = local_128.
                  super__Vector_base<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (bVar7) {
          for (; pmVar25 != pmVar6; pmVar25 = pmVar25 + 1) {
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                        *)local_d8,&local_1a0);
            for (p_Var11 = (pmVar25->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var11 != &(pmVar25->_M_t)._M_impl.super__Rb_tree_header;
                p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
              local_1cc._1_3_ = (undefined3)(local_1cc >> 8);
              local_1cc = CONCAT31(local_1cc._1_3_,(char)p_Var11[1]._M_color);
              std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
              _M_insert_equal<char_const&>
                        ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>
                          *)local_d8,(char *)&local_1cc);
            }
            local_1cc = QUARD;
            local_1b4 = PAIR;
            std::vector<CardStyle,std::allocator<CardStyle>>::
            emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int,int_const&>
                      (local_1c8,&local_1cc,(char *)p_Var1,
                       (multiset<char,_std::less<char>,_std::allocator<char>_> *)local_d8,
                       (int *)&local_1b4,local_1a8);
            std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
            ::~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                         *)local_d8);
          }
        }
        std::
        vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_128);
        std::
        _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
        ::~_Rb_tree(&local_a0);
        goto LAB_00108529;
      }
      std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
      ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>
                 *)&local_158);
      goto LAB_00108abb;
    }
LAB_00108ae1:
    pvVar21 = local_1c8;
    std::vector<CardStyle,_std::allocator<CardStyle>_>::emplace_back<>
              ((vector<CardStyle,_std::allocator<CardStyle>_> *)local_1c8);
  }
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&local_108);
  return (vector<CardStyle,_std::allocator<CardStyle>_> *)pvVar21;
LAB_00108a0b:
  for (; pCVar14 != (CardStyle *)pmVar6;
      pCVar14 = (CardStyle *)
                &(pCVar14->pattern)._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    _Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
             &local_a0,&local_1a0);
    for (p_Var11 = *(_Rb_tree_node_base **)
                    &(pCVar14->pattern)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var11 != (_Rb_tree_node_base *)&pCVar14->len;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      local_1cc._1_3_ = (undefined3)(local_1cc >> 8);
      local_1cc = CONCAT31(local_1cc._1_3_,(char)p_Var11[1]._M_color);
      std::_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>>::
      _M_insert_equal<char_const&>
                ((_Rb_tree<char,char,std::_Identity<char>,std::less<char>,std::allocator<char>> *)
                 &local_a0,(char *)&local_1cc);
    }
    local_1cc = TRIPLE;
    std::vector<CardStyle,std::allocator<CardStyle>>::
    emplace_back<CardStyle::Type,char_const&,std::multiset<char,std::less<char>,std::allocator<char>>&,int&,int_const&>
              (local_1c8,&local_1cc,(char *)p_Var1,
               (multiset<char,_std::less<char>,_std::allocator<char>_> *)&local_a0,(int *)&local_128
               ,local_1a8);
    std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::
    ~_Rb_tree((_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> *)
              &local_a0);
  }
LAB_00108a9c:
  std::
  vector<std::multiset<char,_std::less<char>,_std::allocator<char>_>,_std::allocator<std::multiset<char,_std::less<char>,_std::allocator<char>_>_>_>
  ::~vector(local_d8);
LAB_00108aa4:
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *)local_168);
LAB_00108abb:
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_1a0);
  p_Var10 = (_Base_ptr)std::_Rb_tree_increment(local_1b0);
  if ((_Rb_tree_header *)p_Var10 == &local_108._M_impl.super__Rb_tree_header) goto LAB_00108ae1;
  goto LAB_001082c6;
}

Assistant:

vector<CardStyle> BattleWithLandlord::GenStrategy(const multiset<byte> &style, const CardStyle &last) const {
    vector <CardStyle> all;
    map<byte, int> count;
    for (auto c = style.begin(); c != style.end(); ++c) {
        if (count.find(*c) != count.end()) {
            ++count[*c];
        } else {
            count[*c] = 1;
        }
    }
    auto vice_joker = count.find(17);
    auto joker = count.find(18);
    if (vice_joker != count.end() && joker != count.end()){
        multiset<byte> ms;
        ms.insert(17);
        ms.insert(18);
        all.emplace_back(CardStyle::JOKER_BOMB, 19, ms);
    }
    if (last.type == CardStyle::PASS) {
        for (auto c = count.begin(); c != count.end(); ++c) {
            for (int k = 1; k <= c->second && k <= 4; ++k) {
                multiset<byte> ms;
                for (int i = 0; i < k; ++i) {
                    ms.insert(c->first);
                }
                if (k == 1) {
                    if (c->first > 0)
                        all.emplace_back(CardStyle::MONO, c->first, ms);
                    else
                        all.emplace_back(CardStyle::EXT, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            all.emplace_back(CardStyle::MONO, c->first, ms, len);
                        }
                    }
                } else if (k == 2) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                        }
                    }
                } else if (k == 3) {
                    all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    int len = 1;
                    int prev = c->first;

                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                    }
                    
                    for (int carry : {1, 2}) {
                        ms.clear();
                        ms.insert(c->first);
                        ms.insert(c->first);
                        ms.insert(c->first);
                        len = 1;
                        prev = c->first;
                        auto count_ = count;
                        for (auto it = c; it != count.end();) {
                            count_[it->first] = 0; // in case of 333 + 3

                            vector<multiset<byte> > comb_res;
                            if (GenCarry(count_, len, carry, comb_res)) {
                                for (auto &cs: comb_res) {
                                    multiset<byte> _union = ms;
                                    for (auto x: cs) {
                                        _union.insert(x);
                                    }
                                    all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, carry);
                                }
                            }
                            if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                        }
                    }
                } else {
                    all.emplace_back(CardStyle::QUARD_BOMB, c->first, ms);
                    auto count_ = count;
                    count_[c->first] -= 4;
                    for (auto carry: {1, 2}) {
                        vector<multiset<byte> > comb_res;
                        if (GenCarry(count_, 2, carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::QUARD, c->first, _union, 2, carry);
                            }
                        }
                    }
                }
            }
        }
        sort(all.begin(), all.end(),
             [](const CardStyle &a, const CardStyle &b) {
             return a.pattern.size() > b.pattern.size();
        });
    } else {
        for (auto c = count.begin(); c != count.end(); ++c) {
            multiset<byte> ms;
            if (c->second == 4) {
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                auto style = CardStyle(CardStyle::QUARD_BOMB, c->first, ms);
                if (last < style) {
                    all.emplace_back(style);
                }
                if (last.type == CardStyle::QUARD) {
                    if (c->first <= last.id) continue;
                    auto count_ = count;
                    count_[c->first] -= 4;
                    vector<multiset<byte> > comb_res;
                    if (GenCarry(count_, 2, last.carry, comb_res)) {
                        for (auto &cs: comb_res) {
                            multiset<byte> _union = ms;
                            for (auto x: cs) {
                                _union.insert(x);
                            }
                            all.emplace_back(CardStyle::QUARD, c->first, _union, 2, last.carry);
                        }
                    }
                }
                ms.clear();
            }
            if (last.type == CardStyle::MONO) {
                if (c->first <= last.id) continue;
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::MONO, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev) break;
                        ms.insert(it->first);
                        if (++len > 4) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::MONO, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::PAIR) {
                if (c->first <= last.id || c->second < 2) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.len == 1) {
                    all.emplace_back(CardStyle::PAIR, c->first, ms);
                } else {
                    int len = 1;
                    int prev = c->first;
                    for (auto it = c; next(it) != count.end();) {
                        if ((++it)->first != ++prev || it->second < 2) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        if (++len > 2) {
                            if (len == last.len) {
                                all.emplace_back(CardStyle::PAIR, c->first, ms, len);
                                break;
                            }
                        }
                    }
                }
            } else if (last.type == CardStyle::TRIPLE) {
                if (c->first <= last.id || c->second < 3) continue;
                ms.insert(c->first);
                ms.insert(c->first);
                ms.insert(c->first);
                if (last.carry == 0) {
                    if (last.len == 1) {
                        all.emplace_back(CardStyle::TRIPLE, c->first, ms);
                    } else {
                        int len = 1;
                        int prev = c->first;
                        for (auto it = c; next(it) != count.end();) {
                            if ((++it)->first != ++prev || it->second < 3) break;
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ms.insert(it->first);
                            ++len;
                            if (len == last.len) {
                                all.emplace_back(CardStyle::TRIPLE, c->first, ms, len);
                                break;
                            }
                        }
                    }
                } else {
                    ms.clear();
                    ms.insert(c->first);
                    ms.insert(c->first);
                    ms.insert(c->first);
                    int len = 1;
                    int prev = c->first;
                    auto count_ = count;
                    for (auto it = c; it != count.end();) {
                        count_[it->first] = 0;

                        vector<multiset<byte> > comb_res;
                        if (len == last.len && GenCarry(count_, len, last.carry, comb_res)) {
                            for (auto &cs: comb_res) {
                                multiset<byte> _union = ms;
                                for (auto x: cs) {
                                    _union.insert(x);
                                }
                                all.emplace_back(CardStyle::TRIPLE, c->first, _union, len, last.carry);
                            }
                            break;
                        }

                        if (++it == count.end() || it->first != ++prev || it->second < 3) break;
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ms.insert(it->first);
                        ++len;
                    }
                }
            }
        }
        all.emplace_back(); // PASS
    }
    return all;
}